

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

void __thiscall CSound::Stop(CSound *this,CSampleHandle SampleID)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  int i;
  CSample *pSample;
  int local_24;
  CSampleHandle local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ISound::CSampleHandle::IsValid((CSampleHandle *)0x13ec09);
  if (bVar1) {
    lock_wait((LOCK)0x13ec1e);
    iVar2 = ISound::CSampleHandle::Id(&local_c);
    for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
      if (m_aVoices[local_24].m_pSample == m_aSamples + iVar2) {
        if ((m_aVoices[local_24].m_Flags & 1U) == 0) {
          (m_aVoices[local_24].m_pSample)->m_PausedAt = 0;
        }
        else {
          (m_aVoices[local_24].m_pSample)->m_PausedAt = m_aVoices[local_24].m_Tick;
        }
        m_aVoices[local_24].m_pSample = (CSample *)0x0;
      }
    }
    lock_unlock((LOCK)0x13ed16);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CSound::Stop(CSampleHandle SampleID)
{
	if(!SampleID.IsValid())
		return;

	// TODO: a nice fade out
	lock_wait(m_SoundLock);
	CSample *pSample = &m_aSamples[SampleID.Id()];
	for(int i = 0; i < NUM_VOICES; i++)
	{
		if(m_aVoices[i].m_pSample == pSample)
		{
			if(m_aVoices[i].m_Flags & FLAG_LOOP)
				m_aVoices[i].m_pSample->m_PausedAt = m_aVoices[i].m_Tick;
			else
				m_aVoices[i].m_pSample->m_PausedAt = 0;
			m_aVoices[i].m_pSample = 0;
		}
	}
	lock_unlock(m_SoundLock);
}